

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int bio_fwrite_1d(void *arr,size_t e_sz,uint32 d1,FILE *fp,uint32 *chksum)

{
  int32 iVar1;
  size_t ret;
  uint32 *chksum_local;
  FILE *fp_local;
  size_t sStack_20;
  uint32 d1_local;
  size_t e_sz_local;
  void *arr_local;
  
  fp_local._4_4_ = d1;
  sStack_20 = e_sz;
  e_sz_local = (size_t)arr;
  iVar1 = bio_fwrite((void *)((long)&fp_local + 4),4,1,fp,0,chksum);
  if (iVar1 == 1) {
    arr_local._4_4_ = bio_fwrite((void *)e_sz_local,(int32)sStack_20,fp_local._4_4_,fp,0,chksum);
    if ((long)arr_local._4_4_ != (ulong)fp_local._4_4_) {
      if ((long)arr_local._4_4_ == 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x243,"Unable to write complete data");
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x246,"OS error in bio_fwrite_1d");
      }
      arr_local._4_4_ = -1;
    }
  }
  else {
    if (iVar1 == 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x238,"Unable to write complete data");
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x23b,"OS error in bio_fwrite_1d");
    }
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

int
bio_fwrite_1d(void *arr,
	   size_t e_sz,
	   uint32 d1,
	   FILE *fp,
	   uint32 *chksum)
{
    size_t ret;
    ret = bio_fwrite(&d1, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_1d");
	}
	return -1;
    }

    ret = bio_fwrite(arr, e_sz, d1, fp, 0, chksum);
    if (ret != d1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_1d");
	}

	return -1;
    }

    return ret;
}